

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonLib.c
# Opt level: O0

JL_STATUS JlStructToJsonEx(void *Structure,JlMarshallElement *StructDescription,
                          size_t StructDescriptionCount,JL_OUTPUT_FLAGS OutputFlags,
                          char **pJsonStringBuffer)

{
  JlDataObject *local_40;
  JlDataObject *objectTree;
  char **ppcStack_30;
  JL_STATUS jlStatus;
  char **pJsonStringBuffer_local;
  JL_OUTPUT_FLAGS OutputFlags_local;
  size_t StructDescriptionCount_local;
  JlMarshallElement *StructDescription_local;
  void *Structure_local;
  
  if ((((Structure == (void *)0x0) || (StructDescription == (JlMarshallElement *)0x0)) ||
      (StructDescriptionCount == 0)) || (pJsonStringBuffer == (char **)0x0)) {
    objectTree._4_4_ = JL_STATUS_INVALID_PARAMETER;
  }
  else {
    local_40 = (JlDataObject *)0x0;
    *pJsonStringBuffer = (char *)0x0;
    ppcStack_30 = pJsonStringBuffer;
    pJsonStringBuffer_local = (char **)OutputFlags;
    OutputFlags_local = StructDescriptionCount;
    StructDescriptionCount_local = (size_t)StructDescription;
    StructDescription_local = (JlMarshallElement *)Structure;
    objectTree._4_4_ =
         JlMarshallFromStructToNewDataObject
                   (Structure,StructDescription,StructDescriptionCount,&local_40);
    if (objectTree._4_4_ == JL_STATUS_SUCCESS) {
      objectTree._4_4_ =
           JlOutputJsonEx(local_40,(JL_OUTPUT_FLAGS)pJsonStringBuffer_local,ppcStack_30);
      JlFreeObjectTree(&local_40);
    }
  }
  return objectTree._4_4_;
}

Assistant:

JL_STATUS
    JlStructToJsonEx
    (
        void const*                 Structure,                      // [in]
        JlMarshallElement const*    StructDescription,              // [in]
        size_t                      StructDescriptionCount,         // [in]
        JL_OUTPUT_FLAGS             OutputFlags,                    // [in]
        char**                      pJsonStringBuffer               // [out]
    )
{
    JL_STATUS jlStatus;

    if(     NULL != Structure
        &&  NULL != StructDescription
        &&  0 != StructDescriptionCount
        &&  NULL != pJsonStringBuffer )
    {
        JlDataObject* objectTree = NULL;

        *pJsonStringBuffer = NULL;

        jlStatus = JlMarshallFromStructToNewDataObject( Structure, StructDescription, StructDescriptionCount, &objectTree );
        if( JL_STATUS_SUCCESS == jlStatus )
        {
            jlStatus = JlOutputJsonEx( objectTree, OutputFlags, pJsonStringBuffer );

            // Now free the intermediate objectTree regardless of whether the unmarshall succeeded.
            (void) JlFreeObjectTree( &objectTree );
        }
    }
    else
    {
        jlStatus = JL_STATUS_INVALID_PARAMETER;
    }

    return jlStatus;
}